

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::insert
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this,TypeBase **key)

{
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  pTVar2 = *key;
  if (pTVar2 == (TypeBase *)0x0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
                 );
  }
  uVar3 = this->bucketCount;
  if (uVar3 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar3 = this->bucketCount;
    pTVar2 = *key;
  }
  uVar4 = pTVar2->nameHash;
  iVar5 = 1;
  while( true ) {
    if (iVar5 - uVar3 == 1) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0xf5,
                    "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
                   );
    }
    uVar4 = uVar4 & uVar3 - 1;
    pTVar1 = this->data[uVar4];
    if (pTVar1 == (TypeBase *)0x0) break;
    if (pTVar1 == pTVar2) {
      return;
    }
    uVar4 = uVar4 + iVar5;
    iVar5 = iVar5 + 1;
  }
  this->data[uVar4] = pTVar2;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}